

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O3

void __thiscall LibGens::Ym2612::Ym2612(Ym2612 *this)

{
  Ym2612Private *pYVar1;
  
  pYVar1 = (Ym2612Private *)operator_new(0x77e8);
  pYVar1->q = this;
  if (Ym2612Private::isInit == '\0') {
    Ym2612Private::isInit = '\x01';
    Ym2612Private::doStaticInit();
  }
  this->d = pYVar1;
  this->m_writeLen = 0;
  this->m_enabled = true;
  this->m_dacEnabled = true;
  this->m_improved = true;
  return;
}

Assistant:

Ym2612::Ym2612()
	: d(new Ym2612Private(this))
{
	// TODO: Some initialization should go here!
	m_writeLen = 0;
	m_enabled = true;	// TODO: Make this customizable.
	m_dacEnabled = true;	// TODO: Make this customizable.
	m_improved = true;	// TODO: Make this customizable.
}